

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MinTypMaxExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MinTypMaxExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ExpressionSyntax *args_2,
          Token *args_3,ExpressionSyntax *args_4)

{
  Token colon1;
  Token colon2;
  MinTypMaxExpressionSyntax *pMVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  MinTypMaxExpressionSyntax *in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pMVar1 = (MinTypMaxExpressionSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  colon1.info = in_RCX;
  colon1.kind = (short)in_R8;
  colon1._2_1_ = (char)((ulong)in_R8 >> 0x10);
  colon1.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  colon1.rawLen = (int)((ulong)in_R8 >> 0x20);
  colon2.info = in_RDI;
  colon2.kind = (short)in_RSI;
  colon2._2_1_ = (char)((ulong)in_RSI >> 0x10);
  colon2.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  colon2.rawLen = (int)((ulong)in_RSI >> 0x20);
  slang::syntax::MinTypMaxExpressionSyntax::MinTypMaxExpressionSyntax
            (in_R9,(ExpressionSyntax *)in_RDX[1],colon1,(ExpressionSyntax *)*in_RDX,colon2,
             *(ExpressionSyntax **)(in_R8 + 8));
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }